

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidget::resizeEvent(QGraphicsProxyWidget *this,QGraphicsSceneResizeEvent *event)

{
  bool bVar1;
  QGraphicsProxyWidgetPrivate *this_00;
  QSize s;
  QSizeF *in_RSI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  QGraphicsProxyWidgetPrivate *d;
  QWidget *this_01;
  
  this_01 = *(QWidget **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsProxyWidget *)0x9be62f);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9be645);
  if ((bVar1) && ((*(ushort *)&this_00->field_0x244 >> 2 & 3) != 2)) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9be678);
    QGraphicsSceneResizeEvent::newSize((QGraphicsSceneResizeEvent *)this_00);
    s = QSizeF::toSize(in_RSI);
    QWidget::resize(this_01,(QSize *)s);
  }
  QGraphicsWidget::resizeEvent(in_RDI,(QGraphicsSceneResizeEvent *)in_RSI);
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::resizeEvent(QGraphicsSceneResizeEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (d->widget) {
        if (d->sizeChangeMode != QGraphicsProxyWidgetPrivate::WidgetToProxyMode)
            d->widget->resize(event->newSize().toSize());
    }
    QGraphicsWidget::resizeEvent(event);
}